

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O3

void __thiscall luna::GC::~GC(GC *this)

{
  _Manager_type p_Var1;
  long lVar2;
  undefined8 uVar3;
  
  DestroyGeneration(this,&this->gen0_);
  DestroyGeneration(this,&this->gen1_);
  DestroyGeneration(this,&this->gen2_);
  uVar3 = _sqrt;
  lVar2 = _VTT;
  *(long *)&this->log_stream_ = _VTT;
  *(undefined8 *)(&this->log_stream_ + *(long *)(lVar2 + -0x18)) = uVar3;
  std::filebuf::~filebuf((filebuf *)&this->field_0xe8);
  std::ios_base::~ios_base((ios_base *)&this->field_0x1d8);
  p_Var1 = (this->obj_deleter_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->obj_deleter_,(_Any_data *)&this->obj_deleter_,__destroy_functor);
  }
  std::_Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::~_Deque_base
            (&(this->barriered_).
              super__Deque_base<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>);
  p_Var1 = (this->major_traveller_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->major_traveller_,(_Any_data *)&this->major_traveller_,
              __destroy_functor);
  }
  p_Var1 = (this->minor_traveller_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->minor_traveller_,(_Any_data *)&this->minor_traveller_,
              __destroy_functor);
  }
  return;
}

Assistant:

GC::~GC()
    {
        DestroyGeneration(gen0_);
        DestroyGeneration(gen1_);
        DestroyGeneration(gen2_);
    }